

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dr_mp3.h
# Opt level: O1

void drmp3_reset(drmp3 *pMP3)

{
  byte *pbVar1;
  
  pMP3->pcmFramesConsumedInMP3Frame = 0;
  pMP3->pcmFramesRemainingInMP3Frame = 0;
  pMP3->currentPCMFrame = 0;
  pMP3->dataSize = 0;
  pMP3->field_0x52d0 = pMP3->field_0x52d0 & 0xfe;
  (pMP3->src).bin[0] = 0.0;
  (pMP3->src).bin[1] = 0.0;
  (pMP3->src).bin[2] = 0.0;
  (pMP3->src).bin[3] = 0.0;
  (pMP3->src).cache.cachedFrameCount = 0;
  (pMP3->src).cache.iNextFrame = 0;
  (pMP3->src).algo.linear.alpha = 0.0;
  pbVar1 = (byte *)((long)&(pMP3->src).algo + 8);
  *pbVar1 = *pbVar1 & 0xfc;
  (pMP3->decoder).header[0] = '\0';
  return;
}

Assistant:

void drmp3_reset(drmp3* pMP3)
{
            drmp3_assert(pMP3 != NULL);

    pMP3->pcmFramesConsumedInMP3Frame = 0;
    pMP3->pcmFramesRemainingInMP3Frame = 0;
    pMP3->currentPCMFrame = 0;
    pMP3->dataSize = 0;
    pMP3->atEnd = DRMP3_FALSE;
    pMP3->src.bin[0] = 0;
    pMP3->src.bin[1] = 0;
    pMP3->src.bin[2] = 0;
    pMP3->src.bin[3] = 0;
    pMP3->src.cache.cachedFrameCount = 0;
    pMP3->src.cache.iNextFrame = 0;
    pMP3->src.algo.linear.alpha = 0;
    pMP3->src.algo.linear.isNextFramesLoaded = 0;
    pMP3->src.algo.linear.isPrevFramesLoaded = 0;
    //drmp3_zero_object(&pMP3->decoder);
    drmp3dec_init(&pMP3->decoder);
}